

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

array_container_t * array_container_clone(array_container_t *src)

{
  int iVar1;
  array_container_t *paVar2;
  
  paVar2 = array_container_create_given_capacity(src->capacity);
  if (paVar2 == (array_container_t *)0x0) {
    paVar2 = (array_container_t *)0x0;
  }
  else {
    iVar1 = src->cardinality;
    paVar2->cardinality = iVar1;
    memcpy(paVar2->array,src->array,(long)iVar1 * 2);
  }
  return paVar2;
}

Assistant:

array_container_t *array_container_clone(const array_container_t *src) {
    array_container_t *newcontainer =
        array_container_create_given_capacity(src->capacity);
    if (newcontainer == NULL) return NULL;

    newcontainer->cardinality = src->cardinality;

    memcpy(newcontainer->array, src->array,
           src->cardinality * sizeof(uint16_t));

    return newcontainer;
}